

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void __thiscall
TesterThread::TesterThread
          (TesterThread *this,
          vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
          *all_threads,int id)

{
  int id_local;
  vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  *all_threads_local;
  TesterThread *this_local;
  
  this->_vptr_TesterThread = (_func_int **)&PTR__TesterThread_001beb98;
  this->all_threads_ = all_threads;
  std::mutex::mutex(&this->lock_);
  this->id_ = id;
  AllocatorState::AllocatorState(&this->rnd_,id + 1);
  std::vector<TesterThread::Object,_std::allocator<TesterThread::Object>_>::vector(&this->heap_);
  std::vector<TesterThread::Object,_std::allocator<TesterThread::Object>_>::vector(&this->passed_);
  this->heap_size_ = 0;
  return;
}

Assistant:

TesterThread(std::vector<std::unique_ptr<TesterThread>>& all_threads, int id)
    : all_threads_(all_threads),
      id_(id),
      rnd_(id+1),
      heap_size_(0) {
  }